

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::IfConversion::CheckBlock
          (IfConversion *this,BasicBlock *block,DominatorAnalysis *dominators,BasicBlock **common)

{
  IRContext *pIVar1;
  CFG *this_00;
  uint32_t *puVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *pBVar7;
  BasicBlock *b2;
  Instruction *pIVar8;
  uint uVar9;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  this_00 = (pIVar1->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar8 = (block->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar4 = 0;
  if (pIVar8->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
  }
  pvVar6 = CFG::preds(this_00,uVar4);
  puVar2 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar2 == 8) {
    pBVar7 = IRContext::get_instr_block((this->super_Pass).context_,*puVar2);
    if (pBVar7 != (BasicBlock *)0x0) {
      pIVar8 = (block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar5 = 0;
      uVar4 = 0;
      if (pIVar8->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      pIVar8 = (pBVar7->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar8->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      bVar3 = DominatorTree::Dominates((DominatorTree *)dominators,uVar4,uVar5);
      if (bVar3) {
        return false;
      }
    }
    b2 = IRContext::get_instr_block
                   ((this->super_Pass).context_,
                    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[1]);
    uVar4 = 0;
    if (b2 != (BasicBlock *)0x0) {
      pIVar8 = (block->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar8->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      pIVar8 = (b2->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar5 = 0;
      if (pIVar8->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
      }
      bVar3 = DominatorTree::Dominates((DominatorTree *)dominators,uVar4,uVar5);
      uVar4 = (uint32_t)bVar3;
    }
    if (pBVar7 == b2) {
      return false;
    }
    if ((char)uVar4 != '\0') {
      return false;
    }
    pBVar7 = DominatorAnalysisBase::CommonDominator
                       (&dominators->super_DominatorAnalysisBase,pBVar7,b2);
    *common = pBVar7;
    if (pBVar7 != (BasicBlock *)0x0) {
      pIVar1 = (this->super_Pass).context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
        pBVar7 = *common;
      }
      if (&((pIVar1->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl)->pseudo_entry_block_ !=
          pBVar7) {
        pIVar8 = (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar8 == (Instruction *)0x0) ||
           ((pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        if (((((pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_)->opcode_ ==
              OpBranchConditional) &&
            (pIVar8 = BasicBlock::GetMergeInst(pBVar7), pIVar8 != (Instruction *)0x0)) &&
           (pIVar8->opcode_ == OpSelectionMerge)) {
          uVar9 = (pIVar8->has_result_id_ & 1) + 1;
          if (pIVar8->has_type_id_ == false) {
            uVar9 = (uint)pIVar8->has_result_id_;
          }
          uVar4 = Instruction::GetSingleWordOperand(pIVar8,uVar9 + 1);
          uVar5 = 0;
          if (uVar4 != 2) {
            uVar4 = BasicBlock::MergeBlockIdIfAny(*common);
            pIVar8 = (block->label_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
            if (pIVar8->has_result_id_ == true) {
              uVar5 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
            }
            return uVar4 == uVar5;
          }
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool IfConversion::CheckBlock(BasicBlock* block, DominatorAnalysis* dominators,
                              BasicBlock** common) {
  const std::vector<uint32_t>& preds = cfg()->preds(block->id());

  // TODO(alan-baker): Extend to more than two predecessors
  if (preds.size() != 2) return false;

  BasicBlock* inc0 = context()->get_instr_block(preds[0]);
  if (dominators->Dominates(block, inc0)) return false;

  BasicBlock* inc1 = context()->get_instr_block(preds[1]);
  if (dominators->Dominates(block, inc1)) return false;

  if (inc0 == inc1) {
    // If the predecessor blocks are the same, then there is only 1 value for
    // the OpPhi.  Other transformation should be able to simplify that.
    return false;
  }
  // All phis will have the same common dominator, so cache the result
  // for this block. If there is no common dominator, then we cannot transform
  // any phi in this basic block.
  *common = dominators->CommonDominator(inc0, inc1);
  if (!*common || cfg()->IsPseudoEntryBlock(*common)) return false;
  Instruction* branch = (*common)->terminator();
  if (branch->opcode() != spv::Op::OpBranchConditional) return false;
  auto merge = (*common)->GetMergeInst();
  if (!merge || merge->opcode() != spv::Op::OpSelectionMerge) return false;
  if (spv::SelectionControlMask(merge->GetSingleWordInOperand(1)) ==
      spv::SelectionControlMask::DontFlatten) {
    return false;
  }
  if ((*common)->MergeBlockIdIfAny() != block->id()) return false;

  return true;
}